

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::substitute(SimpSolver *this,Var v,Lit x)

{
  vec<Minisat::Lit,_int> *ps;
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  vec<unsigned_int,_int> *pvVar4;
  uint *puVar5;
  int i;
  long lVar6;
  int j;
  ulong uVar7;
  lbool local_51;
  Var local_50;
  Lit local_4c;
  RegionAllocator<unsigned_int> *local_48;
  vec<unsigned_int,_int> *local_40;
  SimpSolver *local_38;
  
  local_50 = v;
  pcVar3 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                     (&(this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,v);
  if (*pcVar3 != '\0') {
    __assert_fail("!frozen[v]",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x224,"bool Minisat::SimpSolver::substitute(Var, Lit)");
  }
  bVar2 = isEliminated(this,v);
  if (!bVar2) {
    local_51 = Solver::value(&this->super_Solver,v);
    bVar2 = lbool::operator==(&local_51,l_Undef);
    if (!bVar2) {
      __assert_fail("value(v) == l_Undef",
                    "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                    ,0x226,"bool Minisat::SimpSolver::substitute(Var, Lit)");
    }
    if ((this->super_Solver).ok == true) {
      pcVar3 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>
                          ,v);
      *pcVar3 = '\x01';
      lVar6 = 0;
      Solver::setDecisionVar(&this->super_Solver,v,false);
      pvVar4 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
               ::lookup(&this->occurs,&local_50);
      ps = &(this->super_Solver).add_tmp;
      local_48 = &(this->super_Solver).ca.ra;
      local_40 = pvVar4;
      local_38 = this;
      do {
        if (pvVar4->sz <= lVar6) {
          return true;
        }
        puVar5 = RegionAllocator<unsigned_int>::operator[](local_48,pvVar4->data[lVar6]);
        if (ps->data != (Lit *)0x0) {
          (this->super_Solver).add_tmp.sz = 0;
        }
        for (uVar7 = 0; this = local_38, pvVar4 = local_40, uVar7 < *puVar5 >> 5; uVar7 = uVar7 + 1)
        {
          uVar1 = puVar5[uVar7 + 1];
          local_4c.x = uVar1 & 1 ^ x.x;
          if ((int)uVar1 >> 1 != local_50) {
            local_4c.x = uVar1;
          }
          vec<Minisat::Lit,_int>::push(ps,&local_4c);
        }
        removeClause(local_38,local_40->data[lVar6]);
        bVar2 = addClause_(this,ps);
        lVar6 = lVar6 + 1;
      } while (bVar2);
      (this->super_Solver).ok = false;
    }
    return false;
  }
  __assert_fail("!isEliminated(v)",
                "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                ,0x225,"bool Minisat::SimpSolver::substitute(Var, Lit)");
}

Assistant:

bool SimpSolver::substitute(Var v, Lit x)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    if (!ok) return false;

    eliminated[v] = true;
    setDecisionVar(v, false);
    const vec<CRef>& cls = occurs.lookup(v);
    
    vec<Lit>& subst_clause = add_tmp;
    for (int i = 0; i < cls.size(); i++){
        Clause& c = ca[cls[i]];

        subst_clause.clear();
        for (int j = 0; j < c.size(); j++){
            Lit p = c[j];
            subst_clause.push(var(p) == v ? x ^ sign(p) : p);
        }

        removeClause(cls[i]);

        if (!addClause_(subst_clause))
            return ok = false;
    }

    return true;
}